

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmd_protocol.cc
# Opt level: O2

session * __thiscall helix::parity::pmd_protocol::new_session(pmd_protocol *this,void *data)

{
  moldudp64_session<helix::parity::pmd_handler> *this_00;
  
  this_00 = (moldudp64_session<helix::parity::pmd_handler> *)operator_new(0x118);
  nasdaq::moldudp64_session<helix::parity::pmd_handler>::moldudp64_session(this_00,data);
  return &this_00->super_session;
}

Assistant:

session* pmd_protocol::new_session(void *data)
{
    return new nasdaq::moldudp64_session<pmd_handler>(data);
}